

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

void __thiscall
QTcpServer::QTcpServer(QTcpServer *this,SocketType socketType,QTcpServerPrivate *dd,QObject *parent)

{
  QTcpServerPrivate *pQVar1;
  QObject *in_RCX;
  QObjectPrivate *in_RDX;
  SocketType in_ESI;
  QObject *in_RDI;
  QTcpServerPrivate *d;
  
  QObject::QObject(in_RDI,in_RDX,in_RCX);
  *(undefined ***)in_RDI = &PTR_metaObject_0049c5a0;
  pQVar1 = d_func((QTcpServer *)0x2625dc);
  pQVar1->socketType = in_ESI;
  return;
}

Assistant:

QTcpServer::QTcpServer(QAbstractSocket::SocketType socketType, QTcpServerPrivate &dd,
                       QObject *parent) : QObject(dd, parent)
{
    Q_D(QTcpServer);
#if defined(QTCPSERVER_DEBUG)
    qDebug("QTcpServer::QTcpServer(%sSocket, QTcpServerPrivate == %p, parent == %p)",
           socketType == QAbstractSocket::TcpSocket ? "Tcp"
           : socketType == QAbstractSocket::UdpSocket ? "Udp"
           : socketType == QAbstractSocket::SctpSocket ? "Sctp"
           : "Unknown", &dd, parent);
#endif
    d->socketType = socketType;
}